

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStream.h
# Opt level: O3

ostream * Gs::operator<<(ostream *stream,Matrix<float,_3UL,_3UL> *mat)

{
  byte bVar1;
  undefined1 uVar2;
  size_t sVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  float *pfVar7;
  ulong uVar8;
  size_t c;
  long lVar9;
  size_t lengths [3];
  char *local_70;
  long local_68;
  char local_60 [16];
  long local_50;
  size_t asStack_48 [3];
  
  lVar9 = 0;
  pfVar7 = mat->m_;
  do {
    asStack_48[lVar9] = 0;
    lVar6 = 0;
    uVar8 = 0;
    do {
      sVar3 = Details::Length<float>((float *)((long)pfVar7 + lVar6));
      if (uVar8 <= sVar3) {
        uVar8 = sVar3;
      }
      asStack_48[lVar9] = uVar8;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0xc);
    lVar9 = lVar9 + 1;
    pfVar7 = pfVar7 + 3;
  } while (lVar9 != 3);
  local_50 = 0;
  do {
    bVar1 = (local_50 != 2) << 5 | 0x5c;
    if (local_50 == 0) {
      bVar1 = 0x2f;
    }
    local_70._0_1_ = bVar1;
    std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_70,1);
    lVar9 = 0;
    pfVar7 = mat->m_;
    do {
      sVar3 = asStack_48[lVar9];
      sVar4 = Details::Length<float>(pfVar7);
      local_70 = local_60;
      std::__cxx11::string::_M_construct((ulong)&local_70,((char)sVar3 - (char)sVar4) + '\x01');
      std::__ostream_insert<char,std::char_traits<char>>(stream,local_70,local_68);
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      poVar5 = std::ostream::_M_insert<double>((double)*pfVar7);
      local_70._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_70,1);
      lVar6 = local_50;
      lVar9 = lVar9 + 1;
      pfVar7 = pfVar7 + 3;
    } while (lVar9 != 3);
    uVar2 = 0x7c;
    if (local_50 == 2) {
      uVar2 = 0x2f;
    }
    if (local_50 == 0) {
      uVar2 = 0x5c;
    }
    local_70 = (char *)CONCAT71(local_70._1_7_,uVar2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_70,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    local_50 = lVar6 + 1;
    mat = (Matrix<float,_3UL,_3UL> *)((long)mat + 4);
  } while (local_50 != 3);
  return stream;
}

Assistant:

std::ostream& operator << (std::ostream& stream, const Matrix<T, Rows, Cols>& mat)
{
    /* Determine longest elements for each row */
    std::size_t lengths[Matrix<T, Rows, Cols>::columns];

    for (std::size_t c = 0; c < Matrix<T, Rows, Cols>::columns; ++c)
    {
        lengths[c] = 0;
        for (std::size_t r = 0; r < Matrix<T, Rows, Cols>::rows; ++r)
            lengths[c] = std::max<std::size_t>(lengths[c], Details::Length(mat(r, c)));
    }

    /* Write each row */
    for (std::size_t r = 0; r < Rows; ++r)
    {
        stream << (r == 0 ? '/' : r + 1 == Rows ? '\\' : '|');

        for (std::size_t c = 0; c < Cols; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        stream << (r == 0 ? '\\' : r + 1 == Rows ? '/' : '|')  << std::endl;
    }

    return stream;
}